

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O0

void __thiscall
slang::ast::ConditionalStatement::serializeTo(ConditionalStatement *this,ASTSerializer *serializer)

{
  bool bVar1;
  reference pCVar2;
  Expression *__n;
  ASTSerializer *in_RSI;
  long in_RDI;
  string_view sVar3;
  Condition *cond;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *__range2;
  span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>
  *in_stack_ffffffffffffff28;
  __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff30;
  ASTSerializer *pAVar4;
  span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>
  *in_stack_ffffffffffffff38;
  ASTSerializer *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  int local_a0;
  void *local_98;
  int local_90;
  void *local_88;
  size_t local_80;
  int local_70;
  void *local_68;
  int local_60;
  void *local_58;
  int local_50;
  void *local_48;
  __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
  local_30;
  long local_28;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff40,
             (char *)in_stack_ffffffffffffff38);
  sVar3._M_str = (char *)in_RSI;
  sVar3._M_len = in_stack_ffffffffffffff48;
  ASTSerializer::startArray(in_stack_ffffffffffffff40,sVar3);
  local_28 = in_RDI + 0x20;
  local_30._M_current =
       (Condition *)
       std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff28);
  std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>::end
            (in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                      (in_stack_ffffffffffffff30,
                       (__normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
             ::operator*(&local_30);
    ASTSerializer::startObject((ASTSerializer *)0x8669bc);
    pAVar4 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff40,
               (char *)in_stack_ffffffffffffff38);
    __n = not_null<const_slang::ast::Expression_*>::operator*
                    ((not_null<const_slang::ast::Expression_*> *)0x8669ea);
    ASTSerializer::write(pAVar4,local_50,local_48,(size_t)__n);
    if (pCVar2->pattern != (Pattern *)0x0) {
      in_stack_ffffffffffffff40 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_10,
                 (char *)in_stack_ffffffffffffff38);
      ASTSerializer::write(in_stack_ffffffffffffff40,local_60,local_58,(size_t)pCVar2->pattern);
    }
    ASTSerializer::endObject((ASTSerializer *)0x866a64);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  ASTSerializer::endArray((ASTSerializer *)0x866a83);
  pAVar4 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff40,
             (char *)in_stack_ffffffffffffff38);
  sVar3 = ast::toString(None);
  local_80 = sVar3._M_len;
  ASTSerializer::write(pAVar4,local_70,local_68,local_80);
  pAVar4 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff40,
             (char *)local_10);
  ASTSerializer::write(pAVar4,local_90,local_88,*(size_t *)(in_RDI + 0x30));
  if (*(long *)(in_RDI + 0x38) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff40,
               (char *)pAVar4);
    ASTSerializer::write(local_10,local_a0,local_98,*(size_t *)(in_RDI + 0x38));
  }
  return;
}

Assistant:

void ConditionalStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("conditions");
    for (auto& cond : conditions) {
        serializer.startObject();
        serializer.write("expr", *cond.expr);
        if (cond.pattern)
            serializer.write("pattern", *cond.pattern);
        serializer.endObject();
    }
    serializer.endArray();
    serializer.write("check", toString(check));

    serializer.write("ifTrue", ifTrue);
    if (ifFalse)
        serializer.write("ifFalse", *ifFalse);
}